

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall
c4::yml::Parser::_location_from_cont(Parser *this,Tree *tree,size_t node,Location *loc)

{
  pfn_error p_Var1;
  char *pcVar2;
  code *pcVar3;
  Location LVar4;
  bool bVar5;
  undefined1 uVar6;
  NodeData *pNVar7;
  size_t i;
  csubstr *pcVar8;
  char *pcVar9;
  char *val;
  csubstr cVar10;
  char *pcStack_68;
  size_t local_60;
  char msg [40];
  
  pNVar7 = Tree::_p(tree,node);
  if (((pNVar7->m_type).type & (STREAM|MAP)) == NOTYPE) {
    builtin_strncpy(msg,"check failed: (tree.is_container(node))",0x28);
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar3 = (code *)swi(3);
      uVar6 = (*pcVar3)();
      return (bool)uVar6;
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar10 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_60 = cVar10.len;
    pcStack_68 = cVar10.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7fe5) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x7fe5) << 0x40,8);
    LVar4.name.str = pcStack_68;
    LVar4.name.len = local_60;
    (*p_Var1)(msg,0x28,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  pNVar7 = Tree::_p(tree,node);
  if ((~(int)(pNVar7->m_type).type & 0x28U) == 0) {
    val = (this->m_buf).str;
  }
  else {
    pNVar7 = Tree::_p(tree,node);
    val = (pNVar7->m_val).scalar.str;
    bVar5 = Tree::has_children(tree,node);
    if (bVar5) {
      i = Tree::first_child(tree,node);
      pNVar7 = Tree::_p(tree,i);
      if (((pNVar7->m_type).type & KEY) != NOTYPE) {
        pcVar8 = Tree::key(tree,i);
        pcVar2 = pcVar8->str;
        pcVar9 = val;
        if (pcVar2 < val) {
          pcVar9 = pcVar2;
        }
        if (pcVar2 != (char *)0x0) {
          val = pcVar9;
        }
      }
    }
  }
  val_location((Location *)msg,this,val);
  (loc->name).len = msg._32_8_;
  (loc->super_LineCol).col = msg._16_8_;
  (loc->name).str = (char *)msg._24_8_;
  (loc->super_LineCol).offset = msg._0_8_;
  (loc->super_LineCol).line = msg._8_8_;
  return true;
}

Assistant:

bool Parser::_location_from_cont(Tree const& tree, size_t node, Location *C4_RESTRICT loc) const
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, tree.is_container(node));
    if(!tree.is_stream(node))
    {
        const char *node_start = tree._p(node)->m_val.scalar.str;  // this was stored in the container
        if(tree.has_children(node))
        {
            size_t child = tree.first_child(node);
            if(tree.has_key(child))
            {
                // when a map starts, the container was set after the key
                csubstr k = tree.key(child);
                if(k.str && node_start > k.str)
                    node_start = k.str;
            }
        }
        *loc = val_location(node_start);
        return true;
    }
    else // it's a stream
    {
        *loc = val_location(m_buf.str); // just return the front of the buffer
    }
    return true;
}